

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O3

void __thiscall
Rml::ElementDocument::OnPropertyChange(ElementDocument *this,PropertyIdSet *changed_properties)

{
  ElementStyle *this_00;
  ulong uVar1;
  
  Element::OnPropertyChange(&this->super_Element,changed_properties);
  uVar1 = (changed_properties->defined_ids).super__Base_bitset<2UL>._M_w[0];
  if ((uVar1 >> 0x32 & 1) != 0) {
    this_00 = Element::GetStyle(&this->super_Element);
    ElementStyle::DirtyPropertiesWithUnitsRecursive(this_00,REM);
    uVar1 = (changed_properties->defined_ids).super__Base_bitset<2UL>._M_w[0];
  }
  if ((uVar1 & 0x7800000) != 0) {
    this->position_dirty = true;
  }
  return;
}

Assistant:

void ElementDocument::OnPropertyChange(const PropertyIdSet& changed_properties)
{
	Element::OnPropertyChange(changed_properties);

	// If the document's font-size has been changed, we need to dirty all rem properties.
	if (changed_properties.Contains(PropertyId::FontSize))
		GetStyle()->DirtyPropertiesWithUnitsRecursive(Unit::REM);

	if (changed_properties.Contains(PropertyId::Top) ||    //
		changed_properties.Contains(PropertyId::Right) ||  //
		changed_properties.Contains(PropertyId::Bottom) || //
		changed_properties.Contains(PropertyId::Left))
		DirtyPosition();
}